

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::EnhancedLayouts::SSBMemberOffsetAndAlignTest::isDrawRelevant
          (SSBMemberOffsetAndAlignTest *this,GLuint param_1)

{
  RenderContext *pRVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  bool bVar4;
  undefined4 in_register_00000034;
  GLint vs_supported_buffers;
  GLint tes_supported_buffers;
  GLint tcs_supported_buffers;
  GLint gs_supported_buffers;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  long lVar3;
  
  pRVar1 = ((this->super_TextureTestBase).super_TestBase.super_TestCase.m_context)->m_renderCtx;
  iVar2 = (*pRVar1->_vptr_RenderContext[3])(pRVar1,CONCAT44(in_register_00000034,param_1));
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_34 = 0;
  local_38 = 0;
  local_3c = 0;
  local_40 = 0;
  (**(code **)(lVar3 + 0x868))(0x90d7,&local_34);
  (**(code **)(lVar3 + 0x868))(0x90d8,&local_38);
  (**(code **)(lVar3 + 0x868))(0x90d9,&local_3c);
  (**(code **)(lVar3 + 0x868))(0x90d6,&local_40);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                  ,0x2972);
  bVar4 = false;
  if (((0 < local_34) && (bVar4 = false, 0 < local_38)) && (0 < local_3c)) {
    bVar4 = 0 < local_40;
  }
  return bVar4;
}

Assistant:

bool SSBMemberOffsetAndAlignTest::isDrawRelevant(GLuint /* test_case_index */)
{
	const Functions& gl					   = m_context.getRenderContext().getFunctions();
	GLint			 gs_supported_buffers  = 0;
	GLint			 tcs_supported_buffers = 0;
	GLint			 tes_supported_buffers = 0;
	GLint			 vs_supported_buffers  = 0;

	gl.getIntegerv(GL_MAX_GEOMETRY_SHADER_STORAGE_BLOCKS, &gs_supported_buffers);
	gl.getIntegerv(GL_MAX_TESS_CONTROL_SHADER_STORAGE_BLOCKS, &tcs_supported_buffers);
	gl.getIntegerv(GL_MAX_TESS_EVALUATION_SHADER_STORAGE_BLOCKS, &tes_supported_buffers);
	gl.getIntegerv(GL_MAX_VERTEX_SHADER_STORAGE_BLOCKS, &vs_supported_buffers);

	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	return ((1 <= gs_supported_buffers) && (1 <= tcs_supported_buffers) && (1 <= tes_supported_buffers) &&
			(1 <= vs_supported_buffers));
}